

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void VP8YuvToRgb56532_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ulong uVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ushort uVar43;
  ushort uVar44;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [12];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 uVar45;
  undefined6 uVar46;
  undefined8 uVar47;
  undefined1 auVar48 [12];
  undefined1 auVar49 [14];
  undefined1 auVar50 [16];
  undefined1 auVar63 [14];
  undefined1 auVar66 [16];
  
  auVar30 = _DAT_0012c970;
  auVar29 = _DAT_0012c960;
  auVar28 = _DAT_0012c950;
  auVar27 = _DAT_0012c930;
  auVar26 = _DAT_0012c920;
  auVar25 = _DAT_0012c900;
  auVar24 = _DAT_0012c880;
  auVar23 = _DAT_0012c870;
  auVar22 = _DAT_0012c860;
  uVar31 = 0xfffffffffffffff8;
  do {
    uVar47 = *(undefined8 *)(y + uVar31 + 8);
    auVar13[10] = 0;
    auVar13._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar13[0xb] = (char)((ulong)uVar47 >> 0x28);
    auVar16[9] = (char)((ulong)uVar47 >> 0x20);
    auVar16._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar16._10_2_ = auVar13._10_2_;
    auVar19._9_3_ = auVar16._9_3_;
    auVar19._0_9_ = (unkuint9)0;
    auVar64._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar19._8_4_,(char)((ulong)uVar47 >> 0x18))) << 0x38,6);
    auVar64[0] = (char)((ulong)uVar47 >> 0x10);
    auVar64._11_5_ = 0;
    auVar33._1_12_ = SUB1612(auVar64 << 0x28,4);
    auVar33[0] = (char)((ulong)uVar47 >> 8);
    auVar33._13_3_ = 0;
    auVar59._1_14_ = SUB1614(auVar33 << 0x18,2);
    auVar59[0] = (char)uVar47;
    auVar59[0xf] = 0;
    uVar47 = *(undefined8 *)(u + uVar31 + 8);
    auVar14[10] = 0;
    auVar14._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar14[0xb] = (char)((ulong)uVar47 >> 0x28);
    auVar17[9] = (char)((ulong)uVar47 >> 0x20);
    auVar17._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar17._10_2_ = auVar14._10_2_;
    auVar20._9_3_ = auVar17._9_3_;
    auVar20._0_9_ = (unkuint9)0;
    auVar10._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar20._8_4_,(char)((ulong)uVar47 >> 0x18))) << 0x38,6);
    auVar10[0] = (char)((ulong)uVar47 >> 0x10);
    auVar10._11_5_ = 0;
    auVar67._1_12_ = SUB1612(auVar10 << 0x28,4);
    auVar67[0] = (char)((ulong)uVar47 >> 8);
    auVar67._13_3_ = 0;
    auVar61._1_14_ = SUB1614(auVar67 << 0x18,2);
    auVar61[0] = (char)uVar47;
    auVar61[0xf] = 0;
    uVar47 = *(undefined8 *)(v + uVar31 + 8);
    auVar15[10] = 0;
    auVar15._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar15[0xb] = (char)((ulong)uVar47 >> 0x28);
    auVar18[9] = (char)((ulong)uVar47 >> 0x20);
    auVar18._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar18._10_2_ = auVar15._10_2_;
    auVar21._9_3_ = auVar18._9_3_;
    auVar21._0_9_ = (unkuint9)0;
    auVar12._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar21._8_4_,(char)((ulong)uVar47 >> 0x18))) << 0x38,6);
    auVar12[0] = (char)((ulong)uVar47 >> 0x10);
    auVar12._11_5_ = 0;
    auVar11._1_12_ = SUB1612(auVar12 << 0x28,4);
    auVar11[0] = (char)((ulong)uVar47 >> 8);
    auVar11._13_3_ = 0;
    auVar9._1_14_ = SUB1614(auVar11 << 0x18,2);
    auVar9[0] = (char)uVar47;
    auVar9[0xf] = 0;
    auVar33 = pmulhuw(auVar61 << 8,auVar26);
    auVar67 = pmulhuw(auVar9 << 8,auVar27);
    auVar64 = pmulhuw(auVar59 << 8,_DAT_0012c8f0);
    auVar59 = pmulhuw(auVar9 << 8,auVar25);
    auVar60._0_2_ = auVar59._0_2_ + auVar64._0_2_ + -0x379a;
    auVar60._2_2_ = auVar59._2_2_ + auVar64._2_2_ + -0x379a;
    auVar60._4_2_ = auVar59._4_2_ + auVar64._4_2_ + -0x379a;
    auVar60._6_2_ = auVar59._6_2_ + auVar64._6_2_ + -0x379a;
    auVar60._8_2_ = auVar59._8_2_ + auVar64._8_2_ + -0x379a;
    auVar60._10_2_ = auVar59._10_2_ + auVar64._10_2_ + -0x379a;
    auVar60._12_2_ = auVar59._12_2_ + auVar64._12_2_ + -0x379a;
    auVar60._14_2_ = auVar59._14_2_ + auVar64._14_2_ + -0x379a;
    auVar59 = pmulhuw(auVar61 << 8,auVar28);
    auVar59 = paddusw(auVar59,auVar64);
    auVar65._0_2_ = (auVar64._0_2_ - (auVar67._0_2_ + auVar33._0_2_)) + 0x2204;
    auVar65._2_2_ = (auVar64._2_2_ - (auVar67._2_2_ + auVar33._2_2_)) + 0x2204;
    auVar65._4_2_ = (auVar64._4_2_ - (auVar67._4_2_ + auVar33._4_2_)) + 0x2204;
    auVar65._6_2_ = (auVar64._6_2_ - (auVar67._6_2_ + auVar33._6_2_)) + 0x2204;
    auVar65._8_2_ = (auVar64._8_2_ - (auVar67._8_2_ + auVar33._8_2_)) + 0x2204;
    auVar65._10_2_ = (auVar64._10_2_ - (auVar67._10_2_ + auVar33._10_2_)) + 0x2204;
    auVar65._12_2_ = (auVar64._12_2_ - (auVar67._12_2_ + auVar33._12_2_)) + 0x2204;
    auVar65._14_2_ = (auVar64._14_2_ - (auVar67._14_2_ + auVar33._14_2_)) + 0x2204;
    auVar61 = psraw(auVar60,6);
    sVar1 = auVar61._0_2_;
    sVar2 = auVar61._2_2_;
    auVar32[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar61[2] - (0xff < sVar2);
    auVar32[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar61[0] - (0xff < sVar1);
    sVar3 = auVar61._4_2_;
    auVar32[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar61[4] - (0xff < sVar3);
    sVar4 = auVar61._6_2_;
    auVar32[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar61[6] - (0xff < sVar4);
    sVar5 = auVar61._8_2_;
    auVar32[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar61[8] - (0xff < sVar5);
    sVar6 = auVar61._10_2_;
    auVar32[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar61[10] - (0xff < sVar6);
    sVar7 = auVar61._12_2_;
    auVar32[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar61[0xc] - (0xff < sVar7);
    sVar8 = auVar61._14_2_;
    auVar32[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar61[0xe] - (0xff < sVar8);
    auVar32[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar61[0] - (0xff < sVar1);
    auVar32[9] = (0 < sVar2) * (sVar2 < 0x100) * auVar61[2] - (0xff < sVar2);
    auVar32[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar61[4] - (0xff < sVar3);
    auVar32[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar61[6] - (0xff < sVar4);
    auVar32[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar61[8] - (0xff < sVar5);
    auVar32[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar61[10] - (0xff < sVar6);
    auVar32[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar61[0xc] - (0xff < sVar7);
    auVar61 = psraw(auVar65,6);
    sVar1 = auVar61._0_2_;
    sVar2 = auVar61._2_2_;
    uVar43 = CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar61[2] - (0xff < sVar2),
                      (0 < sVar1) * (sVar1 < 0x100) * auVar61[0] - (0xff < sVar1));
    sVar3 = auVar61._4_2_;
    sVar4 = auVar61._6_2_;
    uVar45 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar61[6] - (0xff < sVar4),
                      CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar61[4] - (0xff < sVar3),uVar43));
    sVar5 = auVar61._8_2_;
    sVar6 = auVar61._10_2_;
    uVar46 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar61[10] - (0xff < sVar6),
                      CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar61[8] - (0xff < sVar5),uVar45));
    sVar7 = auVar61._12_2_;
    sVar8 = auVar61._14_2_;
    uVar47 = CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar61[0xe] - (0xff < sVar8),
                      CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar61[0xc] - (0xff < sVar7),uVar46)
                     );
    auVar62._0_10_ =
         CONCAT19((0 < sVar2) * (sVar2 < 0x100) * auVar61[2] - (0xff < sVar2),
                  CONCAT18((0 < sVar1) * (sVar1 < 0x100) * auVar61[0] - (0xff < sVar1),uVar47));
    auVar62[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar61[4] - (0xff < sVar3);
    auVar62[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar61[6] - (0xff < sVar4);
    auVar63[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar61[8] - (0xff < sVar5);
    auVar63._0_12_ = auVar62;
    auVar63[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar61[10] - (0xff < sVar6);
    auVar66[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar61[0xc] - (0xff < sVar7);
    auVar66._0_14_ = auVar63;
    auVar66[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar61[0xe] - (0xff < sVar8);
    auVar34._0_2_ = uVar43 >> 5;
    auVar34._2_2_ = (ushort)((uint)uVar45 >> 0x15);
    auVar34._4_2_ = (ushort)((uint6)uVar46 >> 0x25);
    auVar34._6_2_ = (ushort)((ulong)uVar47 >> 0x35);
    auVar34._8_2_ = (ushort)((unkuint10)auVar62._0_10_ >> 0x45);
    auVar34._10_2_ = auVar62._10_2_ >> 5;
    auVar34._12_2_ = auVar63._12_2_ >> 5;
    auVar34._14_2_ = auVar66._14_2_ >> 5;
    auVar32 = auVar34._0_15_ & auVar23._0_15_ | auVar32 & auVar22._0_15_;
    auVar59 = psubusw(auVar59,auVar29);
    uVar43 = auVar59._0_2_ >> 6;
    uVar52 = auVar59._2_2_ >> 6;
    uVar53 = auVar59._4_2_ >> 6;
    uVar54 = auVar59._6_2_ >> 6;
    uVar55 = auVar59._8_2_ >> 6;
    uVar56 = auVar59._10_2_ >> 6;
    uVar57 = auVar59._12_2_ >> 6;
    uVar58 = auVar59._14_2_ >> 6;
    uVar44 = CONCAT11((uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52),
                      (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43));
    uVar45 = CONCAT13((uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 - (0xff < uVar54),
                      CONCAT12((uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53),
                               uVar44));
    uVar46 = CONCAT15((uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56),
                      CONCAT14((uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55),
                               uVar45));
    uVar47 = CONCAT17((uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58),
                      CONCAT16((uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57),
                               uVar46));
    auVar48._0_10_ =
         CONCAT19((uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52),
                  CONCAT18((uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43),uVar47)
                 );
    auVar48[10] = (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
    auVar48[0xb] = (uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 - (0xff < uVar54);
    auVar49[0xc] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
    auVar49._0_12_ = auVar48;
    auVar49[0xd] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
    auVar50[0xe] = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
    auVar50._0_14_ = auVar49;
    auVar50[0xf] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
    auVar51._0_2_ = uVar44 >> 3;
    auVar51._2_2_ = (ushort)((uint)uVar45 >> 0x13);
    auVar51._4_2_ = (ushort)((uint6)uVar46 >> 0x23);
    auVar51._6_2_ = (ushort)((ulong)uVar47 >> 0x33);
    auVar51._8_2_ = (ushort)((unkuint10)auVar48._0_10_ >> 0x43);
    auVar51._10_2_ = auVar48._10_2_ >> 3;
    auVar51._12_2_ = auVar49._12_2_ >> 3;
    auVar51._14_2_ = auVar50._14_2_ >> 3;
    auVar59 = psllw(auVar66,3);
    auVar59 = auVar59 & auVar24 | auVar51 & auVar30;
    auVar42._0_14_ = auVar32._0_14_;
    auVar42[0xe] = auVar32[7];
    auVar42[0xf] = auVar59[7];
    auVar41._14_2_ = auVar42._14_2_;
    auVar41._0_13_ = auVar32._0_13_;
    auVar41[0xd] = auVar59[6];
    auVar40._13_3_ = auVar41._13_3_;
    auVar40._0_12_ = auVar32._0_12_;
    auVar40[0xc] = auVar32[6];
    auVar39._12_4_ = auVar40._12_4_;
    auVar39._0_11_ = auVar32._0_11_;
    auVar39[0xb] = auVar59[5];
    auVar38._11_5_ = auVar39._11_5_;
    auVar38._0_10_ = auVar32._0_10_;
    auVar38[10] = auVar32[5];
    auVar37._10_6_ = auVar38._10_6_;
    auVar37._0_9_ = auVar32._0_9_;
    auVar37[9] = auVar59[4];
    auVar36._9_7_ = auVar37._9_7_;
    auVar36._0_8_ = auVar32._0_8_;
    auVar36[8] = auVar32[4];
    auVar35._8_8_ = auVar36._8_8_;
    auVar35[7] = auVar59[3];
    auVar35[6] = auVar32[3];
    auVar35[5] = auVar59[2];
    auVar35[4] = auVar32[2];
    auVar35[3] = auVar59[1];
    auVar35[2] = auVar32[1];
    auVar35[0] = auVar32[0];
    auVar35[1] = auVar59[0];
    *(undefined1 (*) [16])(dst + uVar31 * 2 + 0x10) = auVar35;
    uVar31 = uVar31 + 8;
  } while (uVar31 < 0x18);
  return;
}

Assistant:

void VP8YuvToRgb56532_SSE2(const uint8_t* WEBP_RESTRICT y,
                           const uint8_t* WEBP_RESTRICT u,
                           const uint8_t* WEBP_RESTRICT v,
                           uint8_t* WEBP_RESTRICT dst) {
  int n;
  for (n = 0; n < 32; n += 8, dst += 16) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore565_SSE2(&R, &G, &B, dst);
  }
}